

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O0

void __thiscall duel::discardCard(duel *this,uint position,hand *hand__)

{
  hand *this_00;
  bool bVar1;
  uint uVar2;
  reference card_;
  vector<card,_std::allocator<card>_> *this_01;
  __normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_> local_38;
  __normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_> local_30;
  const_iterator local_28;
  hand *local_20;
  hand *hand___local;
  duel *pdStack_10;
  uint position_local;
  duel *this_local;
  
  local_20 = hand__;
  hand___local._4_4_ = position;
  pdStack_10 = this;
  card_ = std::vector<card,_std::allocator<card>_>::at(&hand__->hand_,(ulong)position);
  bVar1 = isRegularCard(card_);
  this_00 = local_20;
  if (bVar1) {
    uVar2 = hand::getRegularCards(local_20);
    hand::setRegularCards(this_00,uVar2 - 1);
  }
  else {
    uVar2 = hand::getSpecialCards(local_20);
    hand::setSpecialCards(this_00,uVar2 - 1);
  }
  this_01 = &local_20->hand_;
  local_38._M_current = (card *)std::vector<card,_std::allocator<card>_>::begin(&local_20->hand_);
  local_30 = __gnu_cxx::__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>::
             operator+(&local_38,(ulong)hand___local._4_4_);
  __gnu_cxx::__normal_iterator<card_const*,std::vector<card,std::allocator<card>>>::
  __normal_iterator<card*>
            ((__normal_iterator<card_const*,std::vector<card,std::allocator<card>>> *)&local_28,
             &local_30);
  std::vector<card,_std::allocator<card>_>::erase(this_01,local_28);
  return;
}

Assistant:

void duel::discardCard(unsigned int position, hand& hand__) {
    if (isRegularCard(hand__.hand_.at(position))) hand__.setRegularCards(hand__.getRegularCards()-1);
    else hand__.setSpecialCards(hand__.getSpecialCards()-1);
    hand__.hand_.erase(hand__.hand_.begin() + position);
}